

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_https.hpp
# Opt level: O1

int __thiscall
SimpleWeb::Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::accept
          (Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,int __fd,
          sockaddr *__addr,socklen_t *__addr_len)

{
  basic_socket_acceptor<asio::ip::tcp> *pbVar1;
  stream<asio::basic_stream_socket<asio::ip::tcp>_> *peer;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar2;
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>
  connection;
  type local_38;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::
  create_connection<asio::io_context&,asio::ssl::context&>
            ((ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>> *)&local_20,
             (io_context *)this,
             (context *)
             (this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>)
             .io_service.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pbVar1 = (this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>).
           acceptor._M_t.
           super___uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
           .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl;
  peer = (local_20->socket)._M_t.
         super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
         .
         super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_false>
         ._M_head_impl;
  local_38.connection.
  super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_20;
  local_38.connection.
  super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_18;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  local_38.this = this;
  asio::detail::reactive_socket_service<asio::ip::tcp>::
  async_accept<asio::basic_socket<asio::ip::tcp>,SimpleWeb::Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::accept()::_lambda(std::error_code_const&)_1_>
            ((pbVar1->
             super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>).
             service_,&(pbVar1->
                       super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                       ).implementation_,(basic_socket<asio::ip::tcp> *)peer,(endpoint_type *)0x0,
             &local_38);
  iVar2 = extraout_EAX;
  if (local_38.connection.
      super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.connection.
               super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    iVar2 = extraout_EAX_00;
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    iVar2 = extraout_EAX_01;
  }
  return iVar2;
}

Assistant:

void accept() override {
      auto connection = create_connection(*io_service, context);

      acceptor->async_accept(connection->socket->lowest_layer(), [this, connection](const error_code &ec) {
        auto lock = connection->handler_runner->continue_lock();
        if(!lock)
          return;

        if(ec != asio::error::operation_aborted)
          this->accept();

        auto session = std::make_shared<Session>(config.max_request_streambuf_size, connection);

        if(!ec) {
          asio::ip::tcp::no_delay option(true);
          error_code ec;
          session->connection->socket->lowest_layer().set_option(option, ec);

          session->connection->set_timeout(config.timeout_request);
          session->connection->socket->async_handshake(asio::ssl::stream_base::server, [this, session](const error_code &ec) {
            session->connection->cancel_timeout();
            auto lock = session->connection->handler_runner->continue_lock();
            if(!lock)
              return;
            if(!ec)
              this->read(session);
            else if(this->on_error)
              this->on_error(session->request, ec);
          });
        }
        else if(this->on_error)
          this->on_error(session->request, ec);
      });
    }